

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O0

void __thiscall Base64Decode_RFC4648FourOut_Test::TestBody(Base64Decode_RFC4648FourOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Tuple_impl<0UL,_char,_char,_char,_char> in_stack_fffffffffffffef0;
  AssertHelper local_e8;
  Message local_e0;
  char local_d4 [4];
  testing local_d0 [4];
  char local_cc [4];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> actual;
  Base64Decode_RFC4648FourOut_Test *this_local;
  
  actual.storage_._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Zm9vYg==",&local_51);
  anon_unknown.dwarf_eada::Base64Decode::convert
            ((maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)local_30,
             &this->super_Base64Decode,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_79 = pstore::maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::
             has_value((maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                       local_30);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_78,(AssertionResult *)"actual.has_value ()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_base64.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    builtin_strncpy(local_d4,"boof",4);
    testing::ElementsAre<char,char,char,char>
              (local_d0,local_d4 + 3,local_d4 + 2,local_d4 + 1,local_d4);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char,char,char>>>
              ((ElementsAreMatcher<std::tuple<char,_char,_char,_char>_>)in_stack_fffffffffffffef0);
    pstore::maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::operator*
              ((maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)local_30);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char,char,char>>>
    ::operator()(local_c8,local_cc,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)"*actual");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_base64.cpp"
                 ,0x82,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  pstore::maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::~maybe
            ((maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)local_30);
  return;
}

Assistant:

TEST_F (Base64Decode, RFC4648FourOut) {
    auto const actual = convert ("Zm9vYg==");
    ASSERT_TRUE (actual.has_value ());
    EXPECT_THAT (*actual, ::testing::ElementsAre ('f', 'o', 'o', 'b'));
}